

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout_p.h
# Opt level: O0

void __thiscall
QToolBarAreaLayoutItem::resize(QToolBarAreaLayoutItem *this,Orientation o,int newSize)

{
  int iVar1;
  int *piVar2;
  undefined4 in_ESI;
  QToolBarAreaLayoutItem *in_RDI;
  long in_FS_OFFSET;
  int sizeh;
  undefined4 in_stack_ffffffffffffffb8;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  minimumSize(in_RDI);
  local_10 = pick((Orientation)((ulong)in_RDI >> 0x20),
                  (QSize *)CONCAT44(in_ESI,in_stack_ffffffffffffffb8));
  piVar2 = qMax<int>(&local_10,&local_c);
  local_c = *piVar2;
  sizeHint(in_RDI);
  iVar1 = pick((Orientation)((ulong)in_RDI >> 0x20),
               (QSize *)CONCAT44(in_ESI,in_stack_ffffffffffffffb8));
  if (local_c == iVar1) {
    in_RDI->preferredSize = -1;
    in_RDI->size = iVar1;
  }
  else {
    in_RDI->preferredSize = local_c;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void resize(Qt::Orientation o, int newSize)
    {
        newSize = qMax(pick(o, minimumSize()), newSize);
        int sizeh = pick(o, sizeHint());
        if (newSize == sizeh) {
            preferredSize = -1;
            size = sizeh;
        } else {
            preferredSize = newSize;
        }
    }